

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatictext.cpp
# Opt level: O0

bool __thiscall QStaticText::operator==(QStaticText *this,QStaticText *other)

{
  bool bVar1;
  QStaticTextPrivate *pQVar2;
  QFont *unaff_retaddr;
  QFont *in_stack_00000008;
  QString *in_stack_ffffffffffffffb8;
  QString *in_stack_ffffffffffffffc0;
  qreal qVar3;
  bool local_21;
  bool local_11;
  
  bVar1 = ::operator==((QExplicitlySharedDataPointer<QStaticTextPrivate> *)in_stack_ffffffffffffffc0
                       ,(QExplicitlySharedDataPointer<QStaticTextPrivate> *)
                        in_stack_ffffffffffffffb8);
  local_11 = true;
  if (!bVar1) {
    QExplicitlySharedDataPointer<QStaticTextPrivate>::operator->
              ((QExplicitlySharedDataPointer<QStaticTextPrivate> *)0x7939f1);
    QExplicitlySharedDataPointer<QStaticTextPrivate>::operator->
              ((QExplicitlySharedDataPointer<QStaticTextPrivate> *)0x793a04);
    bVar1 = ::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_21 = false;
    if (bVar1) {
      QExplicitlySharedDataPointer<QStaticTextPrivate>::operator->
                ((QExplicitlySharedDataPointer<QStaticTextPrivate> *)0x793a2e);
      QExplicitlySharedDataPointer<QStaticTextPrivate>::operator->
                ((QExplicitlySharedDataPointer<QStaticTextPrivate> *)0x793a41);
      bVar1 = QFont::operator==(in_stack_00000008,unaff_retaddr);
      local_21 = false;
      if (bVar1) {
        pQVar2 = QExplicitlySharedDataPointer<QStaticTextPrivate>::operator->
                           ((QExplicitlySharedDataPointer<QStaticTextPrivate> *)0x793a6b);
        qVar3 = pQVar2->textWidth;
        pQVar2 = QExplicitlySharedDataPointer<QStaticTextPrivate>::operator->
                           ((QExplicitlySharedDataPointer<QStaticTextPrivate> *)0x793a80);
        local_21 = qVar3 == pQVar2->textWidth;
      }
    }
    local_11 = local_21;
  }
  return local_11;
}

Assistant:

bool QStaticText::operator==(const QStaticText &other) const
{
    return (data == other.data
            || (data->text == other.data->text
                && data->font == other.data->font
                && data->textWidth == other.data->textWidth));
}